

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

int phr_parse_response(char *buf_start,size_t len,int *minor_version,int *status,char **msg,
                      size_t *msg_len,phr_header *headers,size_t *num_headers,size_t last_len)

{
  char *pcVar1;
  int local_64;
  size_t sStack_60;
  int r;
  size_t max_headers;
  char *buf_end;
  char *buf;
  size_t *msg_len_local;
  char **msg_local;
  int *status_local;
  int *minor_version_local;
  size_t len_local;
  char *buf_start_local;
  
  max_headers = (size_t)(buf_start + len);
  sStack_60 = *num_headers;
  *minor_version = -1;
  *status = 0;
  *msg = (char *)0x0;
  *msg_len = 0;
  *num_headers = 0;
  buf_end = buf_start;
  buf = (char *)msg_len;
  msg_len_local = (size_t *)msg;
  msg_local = (char **)status;
  status_local = minor_version;
  minor_version_local = (int *)len;
  len_local = (size_t)buf_start;
  if ((last_len != 0) &&
     (pcVar1 = is_complete(buf_start,(char *)max_headers,last_len,&local_64), pcVar1 == (char *)0x0)
     ) {
    return local_64;
  }
  pcVar1 = parse_response(buf_end,(char *)max_headers,status_local,(int *)msg_local,
                          (char **)msg_len_local,(size_t *)buf,headers,num_headers,sStack_60,
                          &local_64);
  if (pcVar1 == (char *)0x0) {
    buf_start_local._4_4_ = local_64;
  }
  else {
    buf_start_local._4_4_ = (int)pcVar1 - (int)len_local;
  }
  return buf_start_local._4_4_;
}

Assistant:

int phr_parse_response(const char *buf_start, size_t len, int *minor_version, int *status, const char **msg, size_t *msg_len,
                       struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *minor_version = -1;
    *status = 0;
    *msg = NULL;
    *msg_len = 0;
    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}